

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArena>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadataWithArena *metadata,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  double value;
  undefined4 uVar2;
  byte bVar3;
  byte bVar4;
  float value_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  bool bVar9;
  int iVar10;
  LogMessage *other;
  string *s;
  MessageLite *pMVar12;
  void *pvVar13;
  char *pcVar14;
  undefined4 extraout_var;
  uint uVar11;
  undefined7 in_register_00000011;
  FieldType FVar15;
  uint32 uVar16;
  UnknownFieldSet *this_00;
  FieldDescriptor *pFVar17;
  pair<const_char_*,_int> pVar18;
  pair<const_char_*,_unsigned_long> pVar19;
  pair<const_char_*,_unsigned_long> pVar20;
  pair<const_char_*,_unsigned_long> pVar21;
  pair<const_char_*,_unsigned_long> pVar22;
  pair<const_char_*,_unsigned_long> pVar23;
  LogFinisher local_69;
  LogMessage local_68;
  
  iVar10 = extension->type - 1;
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    switch(iVar10) {
    case 0:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x01',extension->is_packed,extension->descriptor);
      pcVar14 = PackedDoubleParser(pvVar13,ptr,ctx);
      return pcVar14;
    case 1:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x02',extension->is_packed,extension->descriptor);
      pcVar14 = PackedFloatParser(pvVar13,ptr,ctx);
      return pcVar14;
    case 2:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x03',extension->is_packed,extension->descriptor);
      pcVar14 = PackedInt64Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 3:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x04',extension->is_packed,extension->descriptor);
      pcVar14 = PackedUInt64Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 4:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x05',extension->is_packed,extension->descriptor);
      pcVar14 = PackedInt32Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 5:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x06',extension->is_packed,extension->descriptor);
      pcVar14 = PackedFixed64Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 6:
      pvVar13 = MutableRawRepeatedField(this,number,'\a',extension->is_packed,extension->descriptor)
      ;
      pcVar14 = PackedFixed32Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 7:
      pvVar13 = MutableRawRepeatedField(this,number,'\b',extension->is_packed,extension->descriptor)
      ;
      pcVar14 = PackedBoolParser(pvVar13,ptr,ctx);
      return pcVar14;
    case 8:
    case 9:
    case 10:
    case 0xb:
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x4e);
      other = LogMessage::operator<<(&local_68,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
      return ptr;
    case 0xc:
      pvVar13 = MutableRawRepeatedField(this,number,'\r',extension->is_packed,extension->descriptor)
      ;
      pcVar14 = PackedUInt32Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 0xd:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x0e',extension->is_packed,extension->descriptor);
      pcVar14 = PackedEnumParserArg(pvVar13,ptr,ctx,
                                    (_func_bool_void_ptr_int *)
                                    (extension->field_3).enum_validity_check.func,
                                    (extension->field_3).enum_validity_check.arg,metadata,number);
      return pcVar14;
    case 0xe:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x0f',extension->is_packed,extension->descriptor);
      pcVar14 = PackedSFixed32Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 0xf:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x10',extension->is_packed,extension->descriptor);
      pcVar14 = PackedSFixed64Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 0x10:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x11',extension->is_packed,extension->descriptor);
      pcVar14 = PackedSInt32Parser(pvVar13,ptr,ctx);
      return pcVar14;
    case 0x11:
      pvVar13 = MutableRawRepeatedField
                          (this,number,'\x12',extension->is_packed,extension->descriptor);
      pcVar14 = PackedSInt64Parser(pvVar13,ptr,ctx);
      return pcVar14;
    default:
      return ptr;
    }
  }
  switch(iVar10) {
  case 0:
    value = *(double *)ptr;
    ptr = ptr + 8;
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,value,extension->descriptor);
    }
    else {
      SetDouble(this,number,'\x01',value,extension->descriptor);
    }
    break;
  case 1:
    value_00 = *(float *)ptr;
    ptr = ptr + 4;
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,value_00,extension->descriptor);
    }
    else {
      SetFloat(this,number,'\x02',value_00,extension->descriptor);
    }
    break;
  case 2:
    bVar3 = *ptr;
    pVar20.second = (long)(char)bVar3;
    pVar20.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar16 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar20 = VarintParseSlow64(ptr,uVar16);
        if (pVar20.first == (char *)0x0) goto LAB_00305878;
      }
      else {
        pVar20.second._0_4_ = uVar16;
        pVar20.first = ptr + 2;
        pVar20.second._4_4_ = 0;
      }
    }
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\x03';
LAB_00305802:
      AddInt64(this,number,FVar15,bVar9,pVar20.second,pFVar17);
      return pVar20.first;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\x03';
    goto LAB_0030581f;
  case 3:
    bVar3 = *ptr;
    pVar21.second = (long)(char)bVar3;
    pVar21.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar16 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar21 = VarintParseSlow64(ptr,uVar16);
        if (pVar21.first == (char *)0x0) goto LAB_00305878;
      }
      else {
        pVar21.second._0_4_ = uVar16;
        pVar21.first = ptr + 2;
        pVar21.second._4_4_ = 0;
      }
    }
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\x04';
LAB_00305794:
      AddUInt64(this,number,FVar15,bVar9,pVar21.second,pFVar17);
      return pVar21.first;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\x04';
    goto LAB_003057b1;
  case 4:
    bVar3 = *ptr;
    auVar6._8_8_ = (long)(char)bVar3;
    auVar6._0_8_ = ptr + 1;
    auVar8 = auVar6._0_12_;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar16 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar22 = VarintParseSlow64(ptr,uVar16);
        auVar8 = pVar22._0_12_;
        if (pVar22.first == (char *)0x0) goto LAB_00305878;
      }
      else {
        auVar8._8_4_ = uVar16;
        auVar8._0_8_ = ptr + 2;
      }
    }
    ptr = auVar8._0_8_;
    uVar11 = auVar8._8_4_;
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\x05';
LAB_003056ea:
      AddInt32(this,number,FVar15,bVar9,uVar11,pFVar17);
      return ptr;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\x05';
    goto LAB_00305706;
  case 5:
    pVar21.second = *(unsigned_long *)ptr;
    pVar21.first = ptr + 8;
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\x06';
      goto LAB_00305794;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\x06';
LAB_003057b1:
    ptr = pVar21.first;
    SetUInt64(this,number,FVar15,pVar21.second,pFVar17);
    break;
  case 6:
    uVar16 = *(uint32 *)ptr;
    ptr = ptr + 4;
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\a';
      goto LAB_0030568c;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\a';
    goto LAB_003056a8;
  case 7:
    bVar3 = *ptr;
    ptr = ptr + 1;
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,(bool)(bVar3 & 1),extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',(bool)(bVar3 & 1),extension->descriptor);
    }
    break;
  case 8:
  case 0xb:
    if (extension->is_repeated == true) {
      s = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      s = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar3 = *ptr;
    uVar11 = (uint)bVar3;
    if (-1 < (char)bVar3) {
      pcVar14 = ptr + 1;
LAB_0030539f:
      pcVar14 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar14,uVar11,s);
      return pcVar14;
    }
    pVar18 = ReadSizeFallback(ptr,(uint)bVar3);
    uVar11 = pVar18.second;
    pcVar14 = pVar18.first;
    if (pcVar14 != (char *)0x0) goto LAB_0030539f;
    goto LAB_00305878;
  case 9:
    pMVar12 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar12 = AddMessage(this,number,'\n',pMVar12,extension->descriptor);
    }
    else {
      pMVar12 = MutableMessage(this,number,'\n',pMVar12,extension->descriptor);
    }
    iVar10 = ctx->depth_;
    ctx->depth_ = iVar10 + -1;
    if (0 < iVar10) {
      ctx->group_depth_ = ctx->group_depth_ + 1;
      iVar10 = (*pMVar12->_vptr_MessageLite[0xd])(pMVar12,ptr,ctx);
      uVar1 = ctx->depth_;
      uVar2 = ctx->group_depth_;
      ctx->depth_ = uVar1 + 1;
      ctx->group_depth_ = uVar2 + -1;
      uVar16 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar16 != number * 8 + 3U) {
        return (char *)0x0;
      }
      return (char *)CONCAT44(extraout_var,iVar10);
    }
LAB_00305878:
    ptr = (char *)0x0;
    break;
  case 10:
    pMVar12 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar12 = AddMessage(this,number,'\v',pMVar12,extension->descriptor);
    }
    else {
      pMVar12 = MutableMessage(this,number,'\v',pMVar12,extension->descriptor);
    }
    pcVar14 = ParseContext::ParseMessage(ctx,pMVar12,ptr);
    return pcVar14;
  case 0xc:
    bVar3 = *ptr;
    auVar5._8_8_ = (long)(char)bVar3;
    auVar5._0_8_ = ptr + 1;
    auVar7 = auVar5._0_12_;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar16 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar22 = VarintParseSlow64(ptr,uVar16);
        auVar7 = pVar22._0_12_;
        if (pVar22.first == (char *)0x0) goto LAB_00305878;
      }
      else {
        auVar7._8_4_ = uVar16;
        auVar7._0_8_ = ptr + 2;
      }
    }
    ptr = auVar7._0_8_;
    uVar16 = auVar7._8_4_;
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\r';
LAB_0030568c:
      AddUInt32(this,number,FVar15,bVar9,uVar16,pFVar17);
      return ptr;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\r';
LAB_003056a8:
    SetUInt32(this,number,FVar15,uVar16,pFVar17);
    break;
  case 0xd:
    bVar3 = *ptr;
    pVar23.second = (long)(char)bVar3;
    pVar23.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar16 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar23 = VarintParseSlow64(ptr,uVar16);
        if (pVar23.first == (char *)0x0) goto LAB_00305878;
      }
      else {
        pVar23.second._0_4_ = uVar16;
        pVar23.first = ptr + 2;
        pVar23.second._4_4_ = 0;
      }
    }
    ptr = pVar23.first;
    iVar10 = (int)pVar23.second;
    bVar9 = (*(extension->field_3).enum_validity_check.func)
                      ((extension->field_3).enum_validity_check.arg,iVar10);
    if (bVar9) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,iVar10,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',iVar10,extension->descriptor);
      }
    }
    else {
      pvVar13 = (metadata->
                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ).ptr_;
      if (((ulong)pvVar13 & 1) == 0) {
        this_00 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            (&metadata->
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            );
      }
      else {
        this_00 = (UnknownFieldSet *)((ulong)pvVar13 & 0xfffffffffffffffe);
      }
      UnknownFieldSet::AddVarint(this_00,number,pVar23.second);
    }
    break;
  case 0xe:
    uVar11 = *(uint *)ptr;
    ptr = ptr + 4;
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\x0f';
      goto LAB_003056ea;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\x0f';
    goto LAB_00305706;
  case 0xf:
    pVar20.second = *(unsigned_long *)ptr;
    pVar20.first = ptr + 8;
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\x10';
      goto LAB_00305802;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\x10';
    goto LAB_0030581f;
  case 0x10:
    bVar3 = *ptr;
    pVar19.second = (long)(char)bVar3;
    pVar19.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar16 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar19 = VarintParseSlow64(ptr,uVar16);
        if (pVar19.first == (char *)0x0) goto LAB_00305878;
      }
      else {
        pVar19.second._0_4_ = uVar16;
        pVar19.first = ptr + 2;
        pVar19.second._4_4_ = 0;
      }
    }
    ptr = pVar19.first;
    uVar11 = -((uint)pVar19.second & 1) ^ (uint)(pVar19.second >> 1) & 0x7fffffff;
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\x11';
      goto LAB_003056ea;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\x11';
LAB_00305706:
    SetInt32(this,number,FVar15,uVar11,pFVar17);
    break;
  case 0x11:
    bVar3 = *ptr;
    pVar22.second = (long)(char)bVar3;
    pVar22.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar16 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar22 = VarintParseSlow64(ptr,uVar16);
        if (pVar22.first == (char *)0x0) goto LAB_00305878;
      }
      else {
        pVar22.second._0_4_ = uVar16;
        pVar22.first = ptr + 2;
        pVar22.second._4_4_ = 0;
      }
    }
    pVar20.second = -(ulong)((uint)pVar22.second & 1) ^ pVar22.second >> 1;
    pVar20.first = pVar22.first;
    if (extension->is_repeated == true) {
      bVar9 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar15 = '\x12';
      goto LAB_00305802;
    }
    pFVar17 = extension->descriptor;
    FVar15 = '\x12';
LAB_0030581f:
    ptr = pVar20.first;
    SetInt64(this,number,FVar15,pVar20.second,pFVar17);
  }
  return ptr;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    T* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check.func,
            extension.enum_validity_check.arg, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 value;                                                           \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 val;                                                             \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
      HANDLE_FIXED_TYPE(BOOL, Bool, bool);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64 val;
        ptr = VarintParse(ptr, &val);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = val;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          WriteVarint(number, val, metadata->mutable_unknown_fields());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32 tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}